

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O1

void av1_get_layer_resolution
               (int width_org,int height_org,int num,int den,int *width_out,int *height_out)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  if (((den != 0) && (width_out != (int *)0x0)) && (height_out != (int *)0x0)) {
    if (num != 1 || den != 1) {
      uVar1 = (long)(width_org * num) / (long)den;
      uVar2 = (long)(height_org * num) / (long)den;
      iVar3 = (int)uVar1;
      width_org = iVar3 * 2 - ((int)((uVar1 & 0xffffffff) >> 0x1f) + iVar3 & 0xfffffffeU);
      iVar3 = (int)uVar2;
      height_org = iVar3 * 2 - (((uint)(uVar2 >> 0x1f) & 1) + iVar3 & 0xfffffffe);
    }
    *width_out = width_org;
    *height_out = height_org;
  }
  return;
}

Assistant:

void av1_get_layer_resolution(const int width_org, const int height_org,
                              const int num, const int den, int *width_out,
                              int *height_out) {
  int w, h;
  if (width_out == NULL || height_out == NULL || den == 0) return;
  if (den == 1 && num == 1) {
    *width_out = width_org;
    *height_out = height_org;
    return;
  }
  w = width_org * num / den;
  h = height_org * num / den;
  // Make height and width even.
  w += w % 2;
  h += h % 2;
  *width_out = w;
  *height_out = h;
}